

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::forward_inplace(Normalize *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  float fVar3;
  double dVar4;
  int i_8;
  float scale_4;
  float *ptr_7;
  int q_8;
  float a_3;
  float *ptr_6;
  int q_7;
  float ssum_4;
  int i_7;
  int i_6;
  float *ptr_5;
  int q_6;
  float a_2;
  float *ptr_4;
  int q_5;
  float ssum_3;
  int i_5;
  float scale_3;
  Mat square_sum_blob_1;
  int i_4;
  float scale_2;
  float a_1;
  int i_3;
  float ssum_2;
  float *ptr_3;
  int q_4;
  int i_2;
  float scale_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *ptr_1;
  int q_2;
  float scale;
  float a;
  int q_1;
  float ssum;
  int i;
  float ssum_1;
  float *ptr;
  int q;
  Mat square_sum_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  float fVar5;
  Allocator *in_stack_fffffffffffffaa8;
  size_t in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  int _w;
  undefined4 in_stack_fffffffffffffac0;
  float in_stack_fffffffffffffac4;
  Mat *in_stack_fffffffffffffac8;
  float local_4a0;
  int local_400;
  Mat local_3f8;
  float *local_3b0;
  int local_3a4;
  float local_3a0;
  float local_39c;
  Mat local_398;
  float *local_350;
  int local_348;
  float local_344;
  int local_340;
  int local_33c;
  Mat local_338;
  float *local_2f0;
  int local_2e4;
  float local_2e0;
  float local_2dc;
  Mat local_2d8;
  float *local_290;
  int local_288;
  float local_284;
  int local_280;
  float local_27c;
  Mat local_278;
  int local_230;
  float local_22c;
  float local_228;
  float local_224;
  int local_220;
  float local_21c;
  Mat local_218;
  float *local_1d0;
  int local_1c4;
  int local_1c0;
  float local_1bc;
  Mat local_1b8;
  float *local_170;
  int local_168;
  int local_164;
  Mat local_160;
  float *local_118;
  int local_110;
  float local_10c;
  float local_108;
  float local_104;
  int local_100;
  float local_fc;
  int local_f8;
  float local_f4;
  Mat local_f0;
  float *local_a8;
  int local_9c;
  undefined4 local_98;
  Mat local_88;
  int local_3c;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  _w = (int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x38);
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = local_24 * local_28;
  if ((*(int *)(in_RDI + 0xd0) == 0) || (*(int *)(in_RDI + 0xd4) == 0)) {
    if ((*(int *)(in_RDI + 0xd0) == 0) || (*(int *)(in_RDI + 0xd4) != 0)) {
      if ((*(int *)(in_RDI + 0xd0) == 0) && (*(int *)(in_RDI + 0xd4) != 0)) {
        ncnn::Mat::Mat(&local_278);
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),_w,
                          in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
        bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0
                                                ));
        if (bVar1) {
          local_4 = -100;
        }
        else {
          if (*(int *)(in_RDI + 0xd8) == 0) {
            for (local_340 = 0; local_340 < local_3c; local_340 = local_340 + 1) {
              local_344 = 0.0;
              for (local_348 = 0; local_348 < local_2c; local_348 = local_348 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffffac8,(int)in_stack_fffffffffffffac4);
                pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_398);
                ncnn::Mat::~Mat((Mat *)0x6a7e07);
                local_344 = pfVar2[local_340] * pfVar2[local_340] + local_344;
                local_350 = pfVar2;
              }
              if (*(int *)(in_RDI + 0xe4) == 0) {
                dVar4 = std::sqrt((double)(ulong)(uint)(local_344 + *(float *)(in_RDI + 0xdc)));
                local_39c = SUB84(dVar4,0);
              }
              else if (*(int *)(in_RDI + 0xe4) == 1) {
                dVar4 = std::sqrt((double)(ulong)(uint)local_344);
                local_3a0 = SUB84(dVar4,0);
                pfVar2 = std::max<float>(&local_3a0,(float *)(in_RDI + 0xdc));
                local_39c = *pfVar2;
              }
              else {
                pfVar2 = std::max<float>(&local_344,(float *)(in_RDI + 0xdc));
                dVar4 = std::sqrt((double)(ulong)(uint)*pfVar2);
                local_39c = SUB84(dVar4,0);
              }
              local_39c = 1.0 / local_39c;
              in_stack_fffffffffffffac4 = local_39c;
              in_stack_fffffffffffffac8 = (Mat *)ncnn::Mat::operator[](&local_278,(long)local_340);
              *(float *)&in_stack_fffffffffffffac8->data = in_stack_fffffffffffffac4;
            }
            for (local_3a4 = 0; local_3a4 < local_2c; local_3a4 = local_3a4 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffffac8,(int)in_stack_fffffffffffffac4);
              pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_3f8);
              ncnn::Mat::~Mat((Mat *)0x6a8060);
              local_3b0 = pfVar2;
              pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe8),(long)local_3a4);
              fVar3 = *pfVar2;
              for (local_400 = 0; local_400 < local_3c; local_400 = local_400 + 1) {
                fVar5 = local_3b0[local_400];
                pfVar2 = ncnn::Mat::operator[](&local_278,(long)local_400);
                local_3b0[local_400] = fVar5 * *pfVar2 * fVar3;
              }
            }
          }
          else {
            pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe8),0);
            local_27c = *pfVar2;
            for (local_280 = 0; local_280 < local_3c; local_280 = local_280 + 1) {
              local_284 = 0.0;
              for (local_288 = 0; local_288 < local_2c; local_288 = local_288 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffffac8,(int)in_stack_fffffffffffffac4);
                pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_2d8);
                ncnn::Mat::~Mat((Mat *)0x6a7a1c);
                local_284 = pfVar2[local_280] * pfVar2[local_280] + local_284;
                local_290 = pfVar2;
              }
              if (*(int *)(in_RDI + 0xe4) == 0) {
                dVar4 = std::sqrt((double)(ulong)(uint)(local_284 + *(float *)(in_RDI + 0xdc)));
                local_2dc = SUB84(dVar4,0);
              }
              else if (*(int *)(in_RDI + 0xe4) == 1) {
                dVar4 = std::sqrt((double)(ulong)(uint)local_284);
                local_2e0 = SUB84(dVar4,0);
                pfVar2 = std::max<float>(&local_2e0,(float *)(in_RDI + 0xdc));
                local_2dc = *pfVar2;
              }
              else {
                pfVar2 = std::max<float>(&local_284,(float *)(in_RDI + 0xdc));
                dVar4 = std::sqrt((double)(ulong)(uint)*pfVar2);
                local_2dc = SUB84(dVar4,0);
              }
              local_2dc = 1.0 / local_2dc;
              fVar3 = local_2dc * local_27c;
              pfVar2 = ncnn::Mat::operator[](&local_278,(long)local_280);
              *pfVar2 = fVar3;
            }
            for (local_2e4 = 0; local_2e4 < local_2c; local_2e4 = local_2e4 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffffac8,(int)in_stack_fffffffffffffac4);
              pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_338);
              ncnn::Mat::~Mat((Mat *)0x6a7ca9);
              local_2f0 = pfVar2;
              for (local_33c = 0; local_33c < local_3c; local_33c = local_33c + 1) {
                fVar3 = local_2f0[local_33c];
                pfVar2 = ncnn::Mat::operator[](&local_278,(long)local_33c);
                local_2f0[local_33c] = fVar3 * *pfVar2;
              }
            }
          }
          local_4 = 0;
        }
        local_98 = 1;
        ncnn::Mat::~Mat((Mat *)0x6a8193);
      }
      else {
        local_4 = 0;
      }
    }
    else {
      for (local_1c4 = 0; local_1c4 < local_2c; local_1c4 = local_1c4 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffac8,(int)in_stack_fffffffffffffac4);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_218);
        ncnn::Mat::~Mat((Mat *)0x6a75d7);
        local_21c = 0.0;
        for (local_220 = 0; local_220 < local_3c; local_220 = local_220 + 1) {
          local_21c = pfVar2[local_220] * pfVar2[local_220] + local_21c;
        }
        local_1d0 = pfVar2;
        if (*(int *)(in_RDI + 0xe4) == 0) {
          dVar4 = std::sqrt((double)(ulong)(uint)(local_21c + *(float *)(in_RDI + 0xdc)));
          local_224 = SUB84(dVar4,0);
        }
        else if (*(int *)(in_RDI + 0xe4) == 1) {
          dVar4 = std::sqrt((double)(ulong)(uint)local_21c);
          local_228 = SUB84(dVar4,0);
          pfVar2 = std::max<float>(&local_228,(float *)(in_RDI + 0xdc));
          local_224 = *pfVar2;
        }
        else {
          pfVar2 = std::max<float>(&local_21c,(float *)(in_RDI + 0xdc));
          dVar4 = std::sqrt((double)(ulong)(uint)*pfVar2);
          local_224 = SUB84(dVar4,0);
        }
        local_224 = 1.0 / local_224;
        fVar3 = local_224;
        if (*(int *)(in_RDI + 0xd8) == 0) {
          pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe8),(long)local_1c4);
          local_4a0 = *pfVar2;
        }
        else {
          pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe8),0);
          local_4a0 = *pfVar2;
        }
        local_22c = fVar3 * local_4a0;
        for (local_230 = 0; local_230 < local_3c; local_230 = local_230 + 1) {
          local_1d0[local_230] = local_1d0[local_230] * local_22c;
        }
      }
      local_4 = 0;
    }
  }
  else {
    ncnn::Mat::Mat(&local_88);
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),_w,
                      in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_9c = 0; local_9c < local_2c; local_9c = local_9c + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffac8,(int)in_stack_fffffffffffffac4);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_f0);
        ncnn::Mat::~Mat((Mat *)0x6a6f68);
        local_f4 = 0.0;
        for (local_f8 = 0; fVar3 = local_f4, local_f8 < local_3c; local_f8 = local_f8 + 1) {
          local_f4 = pfVar2[local_f8] * pfVar2[local_f8] + local_f4;
        }
        local_a8 = pfVar2;
        pfVar2 = ncnn::Mat::operator[](&local_88,(long)local_9c);
        *pfVar2 = fVar3;
      }
      local_fc = 0.0;
      for (local_100 = 0; local_100 < local_2c; local_100 = local_100 + 1) {
        pfVar2 = ncnn::Mat::operator[](&local_88,(long)local_100);
        local_fc = *pfVar2 + local_fc;
      }
      if (*(int *)(in_RDI + 0xe4) == 0) {
        dVar4 = std::sqrt((double)(ulong)(uint)(local_fc + *(float *)(in_RDI + 0xdc)));
        local_104 = SUB84(dVar4,0);
      }
      else if (*(int *)(in_RDI + 0xe4) == 1) {
        dVar4 = std::sqrt((double)(ulong)(uint)local_fc);
        local_108 = SUB84(dVar4,0);
        pfVar2 = std::max<float>(&local_108,(float *)(in_RDI + 0xdc));
        local_104 = *pfVar2;
      }
      else {
        pfVar2 = std::max<float>(&local_fc,(float *)(in_RDI + 0xdc));
        dVar4 = std::sqrt((double)(ulong)(uint)*pfVar2);
        local_104 = SUB84(dVar4,0);
      }
      local_104 = 1.0 / local_104;
      fVar3 = local_104;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_168 = 0; local_168 < local_2c; local_168 = local_168 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffac8,(int)in_stack_fffffffffffffac4);
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_1b8);
          ncnn::Mat::~Mat((Mat *)0x6a7408);
          fVar3 = local_104;
          local_170 = pfVar2;
          pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe8),(long)local_168);
          local_1bc = fVar3 * *pfVar2;
          for (local_1c0 = 0; local_1c0 < local_3c; local_1c0 = local_1c0 + 1) {
            local_170[local_1c0] = local_170[local_1c0] * local_1bc;
          }
        }
      }
      else {
        pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe8),0);
        local_10c = fVar3 * *pfVar2;
        for (local_110 = 0; local_110 < local_2c; local_110 = local_110 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffac8,(int)in_stack_fffffffffffffac4);
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_160);
          ncnn::Mat::~Mat((Mat *)0x6a72f3);
          for (local_164 = 0; local_164 < local_3c; local_164 = local_164 + 1) {
            pfVar2[local_164] = pfVar2[local_164] * local_10c;
          }
          local_118 = pfVar2;
        }
      }
      local_4 = 0;
    }
    local_98 = 1;
    ncnn::Mat::~Mat((Mat *)0x6a752f);
  }
  return local_4;
}

Assistant:

int Normalize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i = 0; i < size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        float ssum = 0.f;
        for (int q = 0; q < channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        float a;
        if (eps_mode == 0) // caffe/mxnet
        {
            a = static_cast<float>(1.f / sqrt(ssum + eps));
        }
        else if (eps_mode == 1) // pytorch
        {
            a = 1.f / std::max((float)sqrt(ssum), eps);
        }
        else //if (eps_mode == 2) // tensorflow
        {
            a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
        }

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i = 0; i < size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a;
            if (eps_mode == 0) // caffe/mxnet
            {
                a = static_cast<float>(1.f / sqrt(ssum + eps));
            }
            else if (eps_mode == 1) // pytorch
            {
                a = 1.f / std::max((float)sqrt(ssum), eps);
            }
            else //if (eps_mode == 2) // tensorflow
            {
                a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
            }

            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
            {
                float ssum = 0.f;
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = static_cast<float>(1.f / sqrt(ssum + eps));
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
                }

                square_sum_blob[i] = a * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
            {
                float ssum = 0.f;
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = static_cast<float>(1.f / sqrt(ssum + eps));
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
                }

                square_sum_blob[i] = a;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}